

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O3

bool __thiscall
cmStringCommand::HandlePrependCommand
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  pointer pbVar2;
  char *pcVar3;
  ulong uVar4;
  string value;
  string local_70;
  char *local_50;
  undefined8 local_48;
  char local_40;
  undefined7 uStack_3f;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_30;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar4 = (long)pbVar2 - (long)pbVar1;
  if (uVar4 < 0x21) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"sub-command PREPEND requires at least one argument.","");
    cmCommand::SetError(&this->super_cmCommand,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_0025aaf8;
  }
  else {
    if (uVar4 == 0x40) goto LAB_0025aaf8;
    local_30.Begin._M_current = pbVar1 + 2;
    local_48 = 0;
    local_40 = '\0';
    local_50 = &local_40;
    local_30.End._M_current = pbVar2;
    cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (&local_70,&local_30,&local_40);
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    pcVar3 = cmMakefile::GetDefinition((this->super_cmCommand).Makefile,pbVar1 + 1);
    if (pcVar3 != (char *)0x0) {
      std::__cxx11::string::append((char *)&local_70);
    }
    cmMakefile::AddDefinition((this->super_cmCommand).Makefile,pbVar1 + 1,local_70._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_0025aaf8;
  }
  operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
LAB_0025aaf8:
  return 0x20 < uVar4;
}

Assistant:

bool cmStringCommand::HandlePrependCommand(
  std::vector<std::string> const& args)
{
  if (args.size() < 2) {
    this->SetError("sub-command PREPEND requires at least one argument.");
    return false;
  }

  // Skip if nothing to prepend.
  if (args.size() < 3) {
    return true;
  }

  const std::string& variable = args[1];

  std::string value = cmJoin(cmMakeRange(args).advance(2), std::string());
  const char* oldValue = this->Makefile->GetDefinition(variable);
  if (oldValue) {
    value += oldValue;
  }
  this->Makefile->AddDefinition(variable, value.c_str());
  return true;
}